

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::on_finish(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined4 extraout_var;
  reference pptVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string_t *what;
  parser_info_t<cfgfile::string_trait_t> *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  tag_t<cfgfile::string_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range2;
  string *in_stack_fffffffffffff7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f0;
  allocator *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f8;
  exception_t<cfgfile::string_trait_t> *in_stack_fffffffffffff800;
  exception_t<cfgfile::string_trait_t> *this_00;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffff808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff828;
  allocator *__lhs;
  allocator local_749;
  string local_748 [103];
  undefined1 local_6e1 [72];
  allocator local_699;
  string local_698 [71];
  allocator local_651;
  string local_650 [71];
  allocator local_609;
  string local_608 [320];
  tag_t<cfgfile::string_trait_t> *local_4c8;
  tag_t<cfgfile::string_trait_t> **local_4c0;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  local_4b8;
  undefined8 local_4b0;
  undefined1 local_4a2;
  allocator local_4a1;
  string local_4a0 [103];
  allocator local_439;
  string local_438 [71];
  allocator local_3f1;
  string local_3f0 [71];
  allocator local_3a9;
  string local_3a8 [71];
  allocator local_361;
  string local_360 [326];
  undefined1 local_21a;
  allocator local_219;
  string local_218 [103];
  allocator local_1b1;
  string local_1b0 [71];
  allocator local_169;
  string local_168 [87];
  allocator local_111;
  string local_110 [256];
  parser_info_t<cfgfile::string_trait_t> *local_10;
  
  local_10 = in_RSI;
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined_member_value(in_RDI);
  if (!bVar1) {
    local_21a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Undefined value of tag: \"",&local_111);
    string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"\". In file \"",&local_169);
    string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
    std::operator+(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
    std::operator+(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"\" on line ",&local_1b1);
    string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
    std::operator+(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff7e8);
    std::operator+(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,".",&local_219);
    string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
    std::operator+(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    exception_t<cfgfile::string_trait_t>::exception_t
              (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    local_21a = 0;
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  if ((*(long *)&in_RDI[1].field_0x20 != 0) &&
     (uVar4 = (**(code **)(**(long **)&in_RDI[1].field_0x20 + 0x10))
                        (*(long **)&in_RDI[1].field_0x20,in_RDI + 1), (uVar4 & 1) == 0)) {
    local_4a2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"Invalid value: \"",&local_361);
    string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
    std::operator+(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3a8,"\". Value must match to the constraint in tag \"",&local_3a9);
    string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
    std::operator+(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f0,"\". In file \"",&local_3f1);
    string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
    std::operator+(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
    std::operator+(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_438,"\" on line ",&local_439);
    string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
    std::operator+(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff7e8);
    std::operator+(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,".",&local_4a1);
    string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
    std::operator+(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    exception_t<cfgfile::string_trait_t>::exception_t
              (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    local_4a2 = 0;
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  iVar2 = (*in_RDI->_vptr_tag_t[2])();
  local_4b0 = CONCAT44(extraout_var,iVar2);
  local_4b8._M_current =
       (tag_t<cfgfile::string_trait_t> **)
       std::
       vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
       ::begin((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                *)in_stack_fffffffffffff7e8);
  local_4c0 = (tag_t<cfgfile::string_trait_t> **)
              std::
              vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
              ::end((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     *)in_stack_fffffffffffff7e8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_stack_fffffffffffff7f0,
                       (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_stack_fffffffffffff7e8);
    if (!bVar1) {
      return;
    }
    pptVar5 = __gnu_cxx::
              __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
              ::operator*(&local_4b8);
    local_4c8 = *pptVar5;
    bVar1 = tag_t<cfgfile::string_trait_t>::is_mandatory(local_4c8);
    if ((bVar1) &&
       (bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_fffffffffffff808), !bVar1))
    break;
    __gnu_cxx::
    __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
    ::operator++(&local_4b8);
  }
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x30);
  __lhs = &local_609;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"Undefined child mandatory tag: \"",__lhs);
  string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(local_4c8);
  std::operator+(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_650,"\". Where parent is: \"",&local_651);
  string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_698,"\". In file \"",&local_699);
  string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
  std::operator+(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
  this_00 = (exception_t<cfgfile::string_trait_t> *)local_6e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_6e1 + 1),"\" on line ",(allocator *)this_00);
  string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  what = (string_t *)parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
  string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff7e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  paVar6 = &local_749;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_748,".",paVar6);
  string_trait_t::from_ascii(in_stack_fffffffffffff7e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,what);
  __cxa_throw(__rhs,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		if( m_constraint )
		{
			if( !m_constraint->check( m_value ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					m_value +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() +
					Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}